

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fare_attributes.c
# Opt level: O0

feed_db_status_t store_fare_attributes_db(fare_attributes_t *record,feed_db_t *db)

{
  int iVar1;
  char *pcVar2;
  char local_c8 [8];
  char qr [152];
  sqlite3_stmt *local_28;
  sqlite3_stmt *stmt;
  feed_db_t *db_local;
  fare_attributes_t *record_local;
  
  stmt = (sqlite3_stmt *)db;
  db_local = (feed_db_t *)record;
  memcpy(local_c8,
         "INSERT INTO fare_attributes (fare_id, price, currency_type, payment_method,transfers, agency_id, transfer_duration) values (?1, ?2, ?3, ?4,?5, ?6, ?7);"
         ,0x98);
  sqlite3_prepare_v2(*(sqlite3 **)(stmt + 8),local_c8,-1,&local_28,(char **)0x0);
  sqlite3_bind_text(local_28,1,(char *)db_local,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_double(local_28,2,*(double *)&db_local[1].rc);
  sqlite3_bind_text(local_28,3,(char *)&db_local[1].in_transaction,-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_int(local_28,4,*(int *)&db_local[1].field_0x24);
  sqlite3_bind_int(local_28,5,*(int *)&db_local[2].path);
  sqlite3_bind_text(local_28,6,(char *)((long)&db_local[2].path + 4),-1,(_func_void_void_ptr *)0x0);
  sqlite3_bind_double(local_28,7,*(double *)&db_local[3].in_transaction);
  iVar1 = sqlite3_step(local_28);
  *(int *)(stmt + 0x18) = iVar1;
  iVar1 = *(int *)(stmt + 0x18);
  if (iVar1 == 0x65) {
    sqlite3_finalize(local_28);
  }
  else {
    pcVar2 = sqlite3_errmsg(*(sqlite3 **)(stmt + 8));
    pcVar2 = strdup(pcVar2);
    *(char **)(stmt + 0x10) = pcVar2;
    sqlite3_finalize(local_28);
  }
  record_local._4_4_ = (feed_db_status_t)(iVar1 == 0x65);
  return record_local._4_4_;
}

Assistant:

feed_db_status_t store_fare_attributes_db(fare_attributes_t *record, feed_db_t *db) {
    sqlite3_stmt *stmt;
    char qr[] = "INSERT INTO fare_attributes ("
                    "fare_id, price, currency_type, payment_method,"
                    "transfers, agency_id, transfer_duration"
                ") values ("
                    "?1, ?2, ?3, ?4,"
                    "?5, ?6, ?7"
                ");";

    sqlite3_prepare_v2(db->conn, qr, -1, &stmt, NULL);

    sqlite3_bind_text(stmt, 1, record->fare_id, -1, SQLITE_STATIC);
    sqlite3_bind_double(stmt, 2, record->price);
    sqlite3_bind_text(stmt, 3, record->currency_type, -1, SQLITE_STATIC);
    sqlite3_bind_int(stmt, 4, (int)record->payment_method);
    sqlite3_bind_int(stmt, 5, (int)record->transfers);
    sqlite3_bind_text(stmt, 6, record->agency_id, -1, SQLITE_STATIC);
    sqlite3_bind_double(stmt, 7, record->transfer_duration);

    db->rc = sqlite3_step(stmt);
    if (db->rc != SQLITE_DONE) {
        db->error_msg = strdup(sqlite3_errmsg(db->conn));
        sqlite3_finalize(stmt);
        return FEED_DB_ERROR;
    }

    sqlite3_finalize(stmt);
    return FEED_DB_SUCCESS;
}